

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void purge(h2o_cache_t *cache,uint64_t now)

{
  uint uVar1;
  st_h2o_linklist_t *psVar2;
  kh_cache_t *pkVar3;
  khint32_t *pkVar4;
  st_h2o_linklist_t *psVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  khiter_t kVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  if (cache->capacity < cache->size) {
    do {
      psVar2 = (cache->lru).next;
      if (psVar2 == &cache->lru) {
        __assert_fail("!h2o_linklist_is_empty(&cache->lru)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                      ,0x5c,"void purge(h2o_cache_t *, uint64_t)");
      }
      pkVar3 = cache->table;
      kVar9 = pkVar3->n_buckets;
      if (kVar9 == 0) {
        kVar9 = 0;
      }
      else {
        uVar12 = *(uint *)&psVar2[-3].prev & kVar9 - 1;
        pkVar4 = pkVar3->flags;
        iVar11 = 1;
        uVar10 = uVar12;
        do {
          uVar1 = pkVar4[uVar10 >> 4];
          bVar8 = (char)uVar10 * '\x02' & 0x1e;
          uVar6 = uVar1 >> bVar8;
          if ((uVar6 & 2) != 0) {
LAB_0012795d:
            if ((uVar1 >> bVar8 & 3) == 0) {
              kVar9 = uVar10;
            }
            break;
          }
          if ((uVar6 & 1) == 0) {
            psVar5 = (st_h2o_linklist_t *)(pkVar3->keys[uVar10]->key).len;
            if ((psVar5 == psVar2[-3].next) &&
               (iVar7 = bcmp((pkVar3->keys[uVar10]->key).base,psVar2[-4].prev,(size_t)psVar5),
               iVar7 == 0)) goto LAB_0012795d;
          }
          uVar10 = uVar10 + iVar11 & kVar9 - 1;
          iVar11 = iVar11 + 1;
        } while (uVar10 != uVar12);
      }
      erase_ref(cache,kVar9,0);
    } while (cache->capacity < cache->size);
  }
  psVar2 = (cache->age).next;
  do {
    if ((psVar2 == &cache->age) || (-1 < (long)((cache->duration - now) + (long)psVar2[-3].next))) {
      return;
    }
    pkVar3 = cache->table;
    kVar9 = pkVar3->n_buckets;
    if (kVar9 == 0) {
      kVar9 = 0;
    }
    else {
      uVar12 = *(uint *)&psVar2[-4].prev & kVar9 - 1;
      pkVar4 = pkVar3->flags;
      iVar11 = 1;
      uVar10 = uVar12;
      do {
        uVar1 = pkVar4[uVar10 >> 4];
        bVar8 = (char)uVar10 * '\x02' & 0x1e;
        uVar6 = uVar1 >> bVar8;
        if ((uVar6 & 2) != 0) {
LAB_00127a67:
          if ((uVar1 >> bVar8 & 3) == 0) {
            kVar9 = uVar10;
          }
          break;
        }
        if ((uVar6 & 1) == 0) {
          psVar5 = (st_h2o_linklist_t *)(pkVar3->keys[uVar10]->key).len;
          if ((psVar5 == psVar2[-4].next) &&
             (iVar7 = bcmp((pkVar3->keys[uVar10]->key).base,psVar2[-5].prev,(size_t)psVar5),
             iVar7 == 0)) goto LAB_00127a67;
        }
        uVar10 = uVar10 + iVar11 & kVar9 - 1;
        iVar11 = iVar11 + 1;
      } while (uVar10 != uVar12);
    }
    erase_ref(cache,kVar9,0);
    psVar2 = (cache->age).next;
  } while( true );
}

Assistant:

static void purge(h2o_cache_t *cache, uint64_t now)
{
    /* by cache size */
    while (cache->capacity < cache->size) {
        h2o_cache_ref_t *last;
        assert(!h2o_linklist_is_empty(&cache->lru));
        last = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _lru_link, cache->lru.next);
        erase_ref(cache, kh_get(cache, cache->table, last), 0);
    }
    /* by TTL */
    while (!h2o_linklist_is_empty(&cache->age)) {
        h2o_cache_ref_t *oldest = H2O_STRUCT_FROM_MEMBER(h2o_cache_ref_t, _age_link, cache->age.next);
        if (get_timeleft(cache, oldest, now) >= 0)
            break;
        erase_ref(cache, kh_get(cache, cache->table, oldest), 0);
    }
}